

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreeSearchPointPop(RtreeCursor *p)

{
  long lVar1;
  int iVar2;
  double dVar3;
  RtreeNode *pNode;
  RtreeSearchPoint *pRVar4;
  sqlite3_int64 sVar5;
  RtreeSearchPoint *pRVar6;
  u8 uVar7;
  u8 uVar8;
  undefined5 uVar9;
  byte bVar10;
  long lVar11;
  int i;
  int iVar12;
  int j;
  int iVar13;
  double dVar14;
  
  bVar10 = p->bPoint;
  pNode = *(RtreeNode **)((long)p + (1 - (ulong)bVar10) * 8 + 0x58);
  if (pNode != (RtreeNode *)0x0) {
    nodeRelease((Rtree *)(p->base).pVtab,pNode);
    *(undefined8 *)((long)p + (1 - (ulong)bVar10) * 8 + 0x58) = 0;
    bVar10 = p->bPoint;
  }
  if (bVar10 == 0) {
    iVar12 = p->nPoint;
    lVar11 = (long)iVar12;
    if (lVar11 != 0) {
      pRVar4 = p->aPoint;
      p->anQueue[pRVar4->iLevel] = p->anQueue[pRVar4->iLevel] - 1;
      lVar1 = lVar11 + -1;
      iVar13 = (int)lVar1;
      p->nPoint = iVar13;
      pRVar6 = pRVar4 + lVar1;
      uVar7 = pRVar6->eWithin;
      uVar8 = pRVar6->iCell;
      uVar9 = *(undefined5 *)&pRVar6->field_0x13;
      pRVar4->iLevel = pRVar6->iLevel;
      pRVar4->eWithin = uVar7;
      pRVar4->iCell = uVar8;
      *(undefined5 *)&pRVar4->field_0x13 = uVar9;
      sVar5 = pRVar4[lVar1].id;
      pRVar4->rScore = pRVar4[lVar1].rScore;
      pRVar4->id = sVar5;
      if (iVar12 < 5) {
        p->aNode[1] = p->aNode[lVar11];
        p->aNode[lVar11] = (RtreeNode *)0x0;
        if (iVar12 < 3) {
          return;
        }
      }
      iVar12 = 0;
      i = 0;
      j = 1;
      do {
        iVar12 = iVar12 + 2;
        pRVar4 = p->aPoint;
        if (iVar12 < iVar13) {
          pRVar6 = pRVar4 + iVar12;
          dVar3 = pRVar6->rScore;
          dVar14 = pRVar4[j].rScore;
          if ((dVar14 <= dVar3) && ((dVar14 < dVar3 || (pRVar4[j].iLevel <= pRVar6->iLevel))))
          goto LAB_001cc0f7;
          j = iVar12;
          if (pRVar4[i].rScore <= dVar3) {
            if (pRVar4[i].rScore < dVar3) {
              return;
            }
            if (pRVar4[i].iLevel <= pRVar6->iLevel) {
              return;
            }
          }
        }
        else {
          dVar14 = pRVar4[j].rScore;
LAB_001cc0f7:
          if (pRVar4[i].rScore <= dVar14) {
            if (pRVar4[i].rScore < dVar14) {
              return;
            }
            if (pRVar4[i].iLevel <= pRVar4[j].iLevel) {
              return;
            }
          }
        }
        rtreeSearchPointSwap(p,i,j);
        iVar12 = j * 2;
        iVar2 = j * 2 + 1;
        i = j;
        j = iVar2;
      } while (iVar2 < iVar13);
    }
  }
  else {
    p->anQueue[(p->sPoint).iLevel] = p->anQueue[(p->sPoint).iLevel] - 1;
    p->bPoint = '\0';
  }
  return;
}

Assistant:

static void rtreeSearchPointPop(RtreeCursor *p){
  int i, j, k, n;
  i = 1 - p->bPoint;
  assert( i==0 || i==1 );
  if( p->aNode[i] ){
    nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
    p->aNode[i] = 0;
  }
  if( p->bPoint ){
    p->anQueue[p->sPoint.iLevel]--;
    p->bPoint = 0;
  }else if( p->nPoint ){
    p->anQueue[p->aPoint[0].iLevel]--;
    n = --p->nPoint;
    p->aPoint[0] = p->aPoint[n];
    if( n<RTREE_CACHE_SZ-1 ){
      p->aNode[1] = p->aNode[n+1];
      p->aNode[n+1] = 0;
    }
    i = 0;
    while( (j = i*2+1)<n ){
      k = j+1;
      if( k<n && rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[j])<0 ){
        if( rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, k);
          i = k;
        }else{
          break;
        }
      }else{
        if( rtreeSearchPointCompare(&p->aPoint[j], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, j);
          i = j;
        }else{
          break;
        }
      }
    }
  }
}